

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.h
# Opt level: O0

int get_entropy_context(TX_SIZE tx_size,ENTROPY_CONTEXT *a,ENTROPY_CONTEXT *l)

{
  int iVar1;
  long *in_RDX;
  long *in_RSI;
  undefined1 in_DIL;
  ENTROPY_CONTEXT left_ec;
  ENTROPY_CONTEXT above_ec;
  bool local_1a;
  bool local_19;
  
  local_19 = false;
  local_1a = false;
  switch(in_DIL) {
  case 0:
    local_19 = (char)*in_RSI != '\0';
    local_1a = (char)*in_RDX != '\0';
    break;
  case 1:
    local_19 = (short)*in_RSI != 0;
    local_1a = (short)*in_RDX != 0;
    break;
  case 2:
    local_19 = (int)*in_RSI != 0;
    local_1a = (int)*in_RDX != 0;
    break;
  case 3:
    local_19 = *in_RSI != 0;
    local_1a = *in_RDX != 0;
    break;
  case 4:
    local_19 = *in_RSI != 0 || in_RSI[1] != 0;
    local_1a = *in_RDX != 0 || in_RDX[1] != 0;
    break;
  case 5:
    local_19 = (char)*in_RSI != '\0';
    local_1a = (short)*in_RDX != 0;
    break;
  case 6:
    local_19 = (short)*in_RSI != 0;
    local_1a = (char)*in_RDX != '\0';
    break;
  case 7:
    local_19 = (short)*in_RSI != 0;
    local_1a = (int)*in_RDX != 0;
    break;
  case 8:
    local_19 = (int)*in_RSI != 0;
    local_1a = (short)*in_RDX != 0;
    break;
  case 9:
    local_19 = (int)*in_RSI != 0;
    local_1a = *in_RDX != 0;
    break;
  case 10:
    local_19 = *in_RSI != 0;
    local_1a = (int)*in_RDX != 0;
    break;
  case 0xb:
    local_19 = *in_RSI != 0;
    local_1a = *in_RDX != 0 || in_RDX[1] != 0;
    break;
  case 0xc:
    local_19 = *in_RSI != 0 || in_RSI[1] != 0;
    local_1a = *in_RDX != 0;
    break;
  case 0xd:
    local_19 = (char)*in_RSI != '\0';
    local_1a = (int)*in_RDX != 0;
    break;
  case 0xe:
    local_19 = (int)*in_RSI != 0;
    local_1a = (char)*in_RDX != '\0';
    break;
  case 0xf:
    local_19 = (short)*in_RSI != 0;
    local_1a = *in_RDX != 0;
    break;
  case 0x10:
    local_19 = *in_RSI != 0;
    local_1a = (short)*in_RDX != 0;
    break;
  case 0x11:
    local_19 = (int)*in_RSI != 0;
    local_1a = *in_RDX != 0 || in_RDX[1] != 0;
    break;
  case 0x12:
    local_19 = *in_RSI != 0 || in_RSI[1] != 0;
    local_1a = (int)*in_RDX != 0;
  }
  iVar1 = combine_entropy_contexts(local_19,local_1a);
  return iVar1;
}

Assistant:

static inline int get_entropy_context(TX_SIZE tx_size, const ENTROPY_CONTEXT *a,
                                      const ENTROPY_CONTEXT *l) {
  ENTROPY_CONTEXT above_ec = 0, left_ec = 0;

  switch (tx_size) {
    case TX_4X4:
      above_ec = a[0] != 0;
      left_ec = l[0] != 0;
      break;
    case TX_4X8:
      above_ec = a[0] != 0;
      left_ec = !!*(const uint16_t *)l;
      break;
    case TX_8X4:
      above_ec = !!*(const uint16_t *)a;
      left_ec = l[0] != 0;
      break;
    case TX_8X16:
      above_ec = !!*(const uint16_t *)a;
      left_ec = !!*(const uint32_t *)l;
      break;
    case TX_16X8:
      above_ec = !!*(const uint32_t *)a;
      left_ec = !!*(const uint16_t *)l;
      break;
    case TX_16X32:
      above_ec = !!*(const uint32_t *)a;
      left_ec = !!*(const uint64_t *)l;
      break;
    case TX_32X16:
      above_ec = !!*(const uint64_t *)a;
      left_ec = !!*(const uint32_t *)l;
      break;
    case TX_8X8:
      above_ec = !!*(const uint16_t *)a;
      left_ec = !!*(const uint16_t *)l;
      break;
    case TX_16X16:
      above_ec = !!*(const uint32_t *)a;
      left_ec = !!*(const uint32_t *)l;
      break;
    case TX_32X32:
      above_ec = !!*(const uint64_t *)a;
      left_ec = !!*(const uint64_t *)l;
      break;
    case TX_64X64:
      above_ec = !!(*(const uint64_t *)a | *(const uint64_t *)(a + 8));
      left_ec = !!(*(const uint64_t *)l | *(const uint64_t *)(l + 8));
      break;
    case TX_32X64:
      above_ec = !!*(const uint64_t *)a;
      left_ec = !!(*(const uint64_t *)l | *(const uint64_t *)(l + 8));
      break;
    case TX_64X32:
      above_ec = !!(*(const uint64_t *)a | *(const uint64_t *)(a + 8));
      left_ec = !!*(const uint64_t *)l;
      break;
    case TX_4X16:
      above_ec = a[0] != 0;
      left_ec = !!*(const uint32_t *)l;
      break;
    case TX_16X4:
      above_ec = !!*(const uint32_t *)a;
      left_ec = l[0] != 0;
      break;
    case TX_8X32:
      above_ec = !!*(const uint16_t *)a;
      left_ec = !!*(const uint64_t *)l;
      break;
    case TX_32X8:
      above_ec = !!*(const uint64_t *)a;
      left_ec = !!*(const uint16_t *)l;
      break;
    case TX_16X64:
      above_ec = !!*(const uint32_t *)a;
      left_ec = !!(*(const uint64_t *)l | *(const uint64_t *)(l + 8));
      break;
    case TX_64X16:
      above_ec = !!(*(const uint64_t *)a | *(const uint64_t *)(a + 8));
      left_ec = !!*(const uint32_t *)l;
      break;
    default: assert(0 && "Invalid transform size."); break;
  }
  return combine_entropy_contexts(above_ec, left_ec);
}